

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatSoldier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::Decode
          (GED_EnhancedGroundCombatSoldier *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GED_EnhancedGroundCombatSoldier *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x18) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  GED_BasicGroundCombatSoldier::Decode(&this->super_GED_BasicGroundCombatSoldier,local_18);
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui8WaterStatus);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8RestStatus);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8PriAmmun);
  KDataStream::operator>>(pKVar2,&this->m_ui8SecAmmun);
  return;
}

Assistant:

void GED_EnhancedGroundCombatSoldier::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_ENHANCED_GROUND_COMBAT_SOLDIER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    GED_BasicGroundCombatSoldier::Decode( stream );

    stream >> m_ui8WaterStatus
           >> m_ui8RestStatus
           >> m_ui8PriAmmun
           >> m_ui8SecAmmun;
}